

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.cpp
# Opt level: O1

CompressionFunction * duckdb::GetAlpRDFunction<double>(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_ALPRD;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = AlpRDInitAnalyze<double>;
  in_RDI->analyze = AlpRDAnalyze<double>;
  in_RDI->final_analyze = AlpRDFinalAnalyze<double>;
  in_RDI->init_compression = AlpRDInitCompression<double>;
  in_RDI->compress = AlpRDCompress<double>;
  in_RDI->compress_finalize = AlpRDFinalizeCompress<double>;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = AlpRDInitScan<double>;
  in_RDI->scan_vector = AlpRDScan<double>;
  in_RDI->scan_partial = AlpRDScanPartial<double>;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = AlpRDFetchRow<double>;
  in_RDI->skip = AlpRDSkip<double>;
  in_RDI->init_segment = (compression_init_segment_t)0x0;
  in_RDI->init_append = (compression_init_append_t)0x0;
  in_RDI->append = (compression_append_t)0x0;
  in_RDI->finalize_append = (compression_finalize_append_t)0x0;
  in_RDI->revert_append = (compression_revert_append_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  *(undefined8 *)((long)&in_RDI->cleanup_state + 1) = 0;
  *(undefined8 *)((long)&in_RDI->get_segment_info + 1) = 0;
  return in_RDI;
}

Assistant:

CompressionFunction GetAlpRDFunction<double>(PhysicalType data_type) {
	return CompressionFunction(CompressionType::COMPRESSION_ALPRD, data_type, AlpRDInitAnalyze<double>,
	                           AlpRDAnalyze<double>, AlpRDFinalAnalyze<double>, AlpRDInitCompression<double>,
	                           AlpRDCompress<double>, AlpRDFinalizeCompress<double>, AlpRDInitScan<double>,
	                           AlpRDScan<double>, AlpRDScanPartial<double>, AlpRDFetchRow<double>, AlpRDSkip<double>);
}